

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest.c
# Opt level: O2

CURLcode Curl_auth_decode_digest_http_message(char *chlg,digestdata *digest)

{
  char cVar1;
  _Bool _Var2;
  int iVar3;
  char *pcVar4;
  bool bVar5;
  char *token;
  uint local_55c;
  char *local_558;
  char *local_550;
  Curl_str out;
  char value [256];
  char content [1024];
  
  local_550 = digest->nonce;
  local_558 = chlg;
  Curl_auth_digest_cleanup(digest);
  do {
    for (; (*chlg == ' ' || (*chlg == '\t')); chlg = chlg + 1) {
    }
    local_558 = chlg;
    _Var2 = Curl_auth_digest_get_pair(chlg,value,content,&local_558);
    if (!_Var2) {
      if ((local_550 != (char *)0x0) && ((digest->field_0x35 & 1) == 0)) {
        return CURLE_BAD_CONTENT_ENCODING;
      }
      if (digest->nonce == (char *)0x0) {
        return CURLE_BAD_CONTENT_ENCODING;
      }
      if ((digest->qop == (char *)0x0) && ((digest->algo & 1) != 0)) {
        return CURLE_BAD_CONTENT_ENCODING;
      }
      return CURLE_OK;
    }
    iVar3 = curl_strequal(value,"nonce");
    if (iVar3 != 0) {
      (*Curl_cfree)(digest->nonce);
      pcVar4 = (*Curl_cstrdup)(content);
      digest->nonce = pcVar4;
      chlg = local_558;
      goto joined_r0x001651cb;
    }
    iVar3 = curl_strequal(value,"stale");
    if (iVar3 != 0) {
      iVar3 = curl_strequal(content,"true");
      chlg = local_558;
      if (iVar3 != 0) {
        digest->field_0x35 = digest->field_0x35 | 1;
        digest->nc = 1;
      }
      goto LAB_00165019;
    }
    iVar3 = curl_strequal(value,"realm");
    if (iVar3 == 0) {
      iVar3 = curl_strequal(value,"opaque");
      if (iVar3 != 0) {
        (*Curl_cfree)(digest->opaque);
        pcVar4 = (*Curl_cstrdup)(content);
        digest->opaque = pcVar4;
        chlg = local_558;
        goto joined_r0x001651cb;
      }
      iVar3 = curl_strequal(value,"qop");
      pcVar4 = content;
      if (iVar3 != 0) {
        do {
          do {
            token = pcVar4;
            pcVar4 = token + 1;
          } while (pcVar4[-1] == '\t');
        } while (pcVar4[-1] == ' ');
        local_55c = 0;
        bVar5 = false;
        while (iVar3 = Curl_str_until(&token,&out,0x20,','), iVar3 == 0) {
          iVar3 = Curl_str_casecompare(&out,"auth");
          if (iVar3 == 0) {
            iVar3 = Curl_str_casecompare(&out,"auth-int");
            bVar5 = (bool)(bVar5 | iVar3 != 0);
          }
          else {
            local_55c = (uint)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
          }
          iVar3 = Curl_str_single(&token,',');
          pcVar4 = token;
          if (iVar3 != 0) break;
          do {
            do {
              token = pcVar4;
              pcVar4 = token + 1;
            } while (*token == ' ');
          } while (*token == '\t');
        }
        if ((local_55c & 1) == 0) {
          chlg = local_558;
          if (!bVar5) goto LAB_00165019;
          (*Curl_cfree)(digest->qop);
          pcVar4 = (*Curl_cstrdup)("auth-int");
          digest->qop = pcVar4;
          chlg = local_558;
        }
        else {
          (*Curl_cfree)(digest->qop);
          pcVar4 = (*Curl_cstrdup)("auth");
          digest->qop = pcVar4;
          chlg = local_558;
        }
        goto joined_r0x001651cb;
      }
      iVar3 = curl_strequal(value,"algorithm");
      if (iVar3 == 0) {
        iVar3 = curl_strequal(value,"userhash");
        chlg = local_558;
        if ((iVar3 != 0) && (iVar3 = curl_strequal(content,"true"), chlg = local_558, iVar3 != 0)) {
          digest->field_0x35 = digest->field_0x35 | 2;
        }
      }
      else {
        (*Curl_cfree)(digest->algorithm);
        pcVar4 = (*Curl_cstrdup)(content);
        digest->algorithm = pcVar4;
        if (pcVar4 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        iVar3 = curl_strequal(content,"MD5-sess");
        if (iVar3 == 0) {
          iVar3 = curl_strequal(content,"MD5");
          if (iVar3 == 0) {
            iVar3 = curl_strequal(content,"SHA-256");
            if (iVar3 == 0) {
              iVar3 = curl_strequal(content,"SHA-256-SESS");
              if (iVar3 == 0) {
                iVar3 = curl_strequal(content,"SHA-512-256");
                if (iVar3 == 0) {
                  iVar3 = curl_strequal(content,"SHA-512-256-SESS");
                  if (iVar3 == 0) {
                    return CURLE_BAD_CONTENT_ENCODING;
                  }
                  digest->algo = '\x05';
                  chlg = local_558;
                }
                else {
                  digest->algo = '\x04';
                  chlg = local_558;
                }
              }
              else {
                digest->algo = '\x03';
                chlg = local_558;
              }
            }
            else {
              digest->algo = '\x02';
              chlg = local_558;
            }
          }
          else {
            digest->algo = '\0';
            chlg = local_558;
          }
        }
        else {
          digest->algo = '\x01';
          chlg = local_558;
        }
      }
    }
    else {
      (*Curl_cfree)(digest->realm);
      pcVar4 = (*Curl_cstrdup)(content);
      digest->realm = pcVar4;
      chlg = local_558;
joined_r0x001651cb:
      if (pcVar4 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
    }
LAB_00165019:
    for (; (cVar1 = *chlg, cVar1 == '\t' || (cVar1 == ' ')); chlg = chlg + 1) {
    }
    if (cVar1 == ',') {
      chlg = chlg + 1;
    }
  } while( true );
}

Assistant:

CURLcode Curl_auth_decode_digest_http_message(const char *chlg,
                                              struct digestdata *digest)
{
  bool before = FALSE; /* got a nonce before */

  /* If we already have received a nonce, keep that in mind */
  if(digest->nonce)
    before = TRUE;

  /* Clean up any former leftovers and initialise to defaults */
  Curl_auth_digest_cleanup(digest);

  for(;;) {
    char value[DIGEST_MAX_VALUE_LENGTH];
    char content[DIGEST_MAX_CONTENT_LENGTH];

    /* Pass all additional spaces here */
    while(*chlg && ISBLANK(*chlg))
      chlg++;

    /* Extract a value=content pair */
    if(Curl_auth_digest_get_pair(chlg, value, content, &chlg)) {
      if(strcasecompare(value, "nonce")) {
        free(digest->nonce);
        digest->nonce = strdup(content);
        if(!digest->nonce)
          return CURLE_OUT_OF_MEMORY;
      }
      else if(strcasecompare(value, "stale")) {
        if(strcasecompare(content, "true")) {
          digest->stale = TRUE;
          digest->nc = 1; /* we make a new nonce now */
        }
      }
      else if(strcasecompare(value, "realm")) {
        free(digest->realm);
        digest->realm = strdup(content);
        if(!digest->realm)
          return CURLE_OUT_OF_MEMORY;
      }
      else if(strcasecompare(value, "opaque")) {
        free(digest->opaque);
        digest->opaque = strdup(content);
        if(!digest->opaque)
          return CURLE_OUT_OF_MEMORY;
      }
      else if(strcasecompare(value, "qop")) {
        const char *token = content;
        struct Curl_str out;
        bool foundAuth = FALSE;
        bool foundAuthInt = FALSE;
        /* Pass leading spaces */
        while(*token && ISBLANK(*token))
          token++;
        while(!Curl_str_until(&token, &out, 32, ',')) {
          if(Curl_str_casecompare(&out, DIGEST_QOP_VALUE_STRING_AUTH))
            foundAuth = TRUE;
          else if(Curl_str_casecompare(&out,
                                       DIGEST_QOP_VALUE_STRING_AUTH_INT))
            foundAuthInt = TRUE;
          if(Curl_str_single(&token, ','))
            break;
          while(*token && ISBLANK(*token))
            token++;
        }

        /* Select only auth or auth-int. Otherwise, ignore */
        if(foundAuth) {
          free(digest->qop);
          digest->qop = strdup(DIGEST_QOP_VALUE_STRING_AUTH);
          if(!digest->qop)
            return CURLE_OUT_OF_MEMORY;
        }
        else if(foundAuthInt) {
          free(digest->qop);
          digest->qop = strdup(DIGEST_QOP_VALUE_STRING_AUTH_INT);
          if(!digest->qop)
            return CURLE_OUT_OF_MEMORY;
        }
      }
      else if(strcasecompare(value, "algorithm")) {
        free(digest->algorithm);
        digest->algorithm = strdup(content);
        if(!digest->algorithm)
          return CURLE_OUT_OF_MEMORY;

        if(strcasecompare(content, "MD5-sess"))
          digest->algo = ALGO_MD5SESS;
        else if(strcasecompare(content, "MD5"))
          digest->algo = ALGO_MD5;
        else if(strcasecompare(content, "SHA-256"))
          digest->algo = ALGO_SHA256;
        else if(strcasecompare(content, "SHA-256-SESS"))
          digest->algo = ALGO_SHA256SESS;
        else if(strcasecompare(content, "SHA-512-256")) {
#ifdef CURL_HAVE_SHA512_256
          digest->algo = ALGO_SHA512_256;
#else  /* ! CURL_HAVE_SHA512_256 */
          return CURLE_NOT_BUILT_IN;
#endif /* ! CURL_HAVE_SHA512_256 */
        }
        else if(strcasecompare(content, "SHA-512-256-SESS")) {
#ifdef CURL_HAVE_SHA512_256
          digest->algo = ALGO_SHA512_256SESS;
#else  /* ! CURL_HAVE_SHA512_256 */
          return CURLE_NOT_BUILT_IN;
#endif /* ! CURL_HAVE_SHA512_256 */
        }
        else
          return CURLE_BAD_CONTENT_ENCODING;
      }
      else if(strcasecompare(value, "userhash")) {
        if(strcasecompare(content, "true")) {
          digest->userhash = TRUE;
        }
      }
      else {
        /* Unknown specifier, ignore it! */
      }
    }
    else
      break; /* We are done here */

    /* Pass all additional spaces here */
    while(*chlg && ISBLANK(*chlg))
      chlg++;

    /* Allow the list to be comma-separated */
    if(',' == *chlg)
      chlg++;
  }

  /* We had a nonce since before, and we got another one now without
     'stale=true'. This means we provided bad credentials in the previous
     request */
  if(before && !digest->stale)
    return CURLE_BAD_CONTENT_ENCODING;

  /* We got this header without a nonce, that is a bad Digest line! */
  if(!digest->nonce)
    return CURLE_BAD_CONTENT_ENCODING;

  /* "<algo>-sess" protocol versions require "auth" or "auth-int" qop */
  if(!digest->qop && (digest->algo & SESSION_ALGO))
    return CURLE_BAD_CONTENT_ENCODING;

  return CURLE_OK;
}